

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopResize(sqlite3 *db,WhereLoop *p,int n)

{
  WhereTerm **__dest;
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if ((int)(uint)p->nLSlot < n) {
    uVar2 = n + 7U & 0xfffffff8;
    __dest = (WhereTerm **)sqlite3DbMallocRawNN(db,(ulong)uVar2 * 8);
    if (__dest == (WhereTerm **)0x0) {
      iVar1 = 7;
    }
    else {
      memcpy(__dest,p->aLTerm,(ulong)p->nLSlot << 3);
      if (p->aLTerm != p->aLTermSpace) {
        sqlite3DbFreeNN(db,p->aLTerm);
      }
      p->aLTerm = __dest;
      p->nLSlot = (u16)uVar2;
    }
  }
  return iVar1;
}

Assistant:

static int whereLoopResize(sqlite3 *db, WhereLoop *p, int n){
  WhereTerm **paNew;
  if( p->nLSlot>=n ) return SQLITE_OK;
  n = (n+7)&~7;
  paNew = sqlite3DbMallocRawNN(db, sizeof(p->aLTerm[0])*n);
  if( paNew==0 ) return SQLITE_NOMEM_BKPT;
  memcpy(paNew, p->aLTerm, sizeof(p->aLTerm[0])*p->nLSlot);
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFreeNN(db, p->aLTerm);
  p->aLTerm = paNew;
  p->nLSlot = n;
  return SQLITE_OK;
}